

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

void __thiscall Assimp::Discreet3DSImporter::ReadChunk(Discreet3DSImporter *this,Chunk *pcOut)

{
  StreamReaderLE *pSVar1;
  uint16_t uVar2;
  uint uVar3;
  Logger *this_00;
  runtime_error *this_01;
  int iVar4;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (pcOut == (Chunk *)0x0) {
    __assert_fail("pcOut != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/3DS/3DSLoader.cpp"
                  ,0xfa,"void Assimp::Discreet3DSImporter::ReadChunk(Discreet3DS::Chunk *)");
  }
  uVar2 = StreamReader<false,_false>::Get<short>(this->stream);
  pcOut->Flag = uVar2;
  uVar3 = StreamReader<false,_false>::Get<int>(this->stream);
  pcOut->Size = uVar3;
  pSVar1 = this->stream;
  iVar4 = (int)pSVar1->current;
  if ((ulong)uVar3 - 6 <= (ulong)(uint)(*(int *)&pSVar1->end - iVar4)) {
    if ((ulong)(uint)(*(int *)&pSVar1->limit - iVar4) < (ulong)uVar3 - 6) {
      this_00 = DefaultLogger::get();
      Logger::error(this_00,"3DS: Chunk overflow");
      return;
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Chunk is too large","");
  std::runtime_error::runtime_error(this_01,(string *)local_40);
  *(undefined ***)this_01 = &PTR__runtime_error_008e3168;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Discreet3DSImporter::ReadChunk(Discreet3DS::Chunk* pcOut)
{
    ai_assert(pcOut != nullptr);

    pcOut->Flag = stream->GetI2();
    pcOut->Size = stream->GetI4();

    if (pcOut->Size - sizeof(Discreet3DS::Chunk) > stream->GetRemainingSize()) {
        throw DeadlyImportError("Chunk is too large");
    }

    if (pcOut->Size - sizeof(Discreet3DS::Chunk) > stream->GetRemainingSizeToLimit()) {
        ASSIMP_LOG_ERROR("3DS: Chunk overflow");
    }
}